

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

FloatingConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (longdouble v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatSinkImpl *sink_local;
  longdouble v_local;
  FormatConversionSpecImpl conv_local;
  
  bVar1 = anon_unknown_53::ConvertFloatArg<long_double>(v,conv,sink);
  return (FloatingConvertResult)bVar1;
}

Assistant:

FloatingConvertResult FormatConvertImpl(long double v,
                                        const FormatConversionSpecImpl conv,
                                        FormatSinkImpl *sink) {
  return {ConvertFloatArg(v, conv, sink)};
}